

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

void sexp_set_twos_complement(sexp_conflict a)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = (uint)(a->value).fileno.fd;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)(uVar2 & 0x7fffffff) + 1;
    do {
      puVar1 = (ulong *)((long)&a->value + uVar3 * 8);
      *puVar1 = ~*puVar1;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  lVar4 = 1;
  uVar3 = 1;
  do {
    puVar1 = (ulong *)((long)&a->value + lVar4 * 8 + 8);
    bVar5 = CARRY8(*puVar1,uVar3);
    *puVar1 = *puVar1 + uVar3;
    if ((int)uVar2 <= lVar4) {
      return;
    }
    uVar3 = (ulong)bVar5;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  return;
}

Assistant:

static void sexp_set_twos_complement (sexp a) {
  int i, len=sexp_bignum_length(a), carry = 1;
  sexp_uint_t* data = sexp_bignum_data(a), n;
  for (i=len-1; i >=0; --i)
    data[i] = ~data[i];
  /* sexp_bignum_fxadd with no final carry */
  i = 0;
  do { n = data[i];
       data[i] += carry;
       carry = (n > (SEXP_UINT_T_MAX - carry));
  } while (++i<len && carry);
}